

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

char __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_chars<2ul>
          (parser_t<events_aggregator_t> *this,char (*expected) [2])

{
  size_t sVar1;
  char cVar2;
  parser_error_t *this_00;
  char ch;
  size_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string list;
  
  if ((*expected)[1] != '\0') {
    __assert_fail("expected[N - 1] == \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/include/loltoml/detail/parser.hpp"
                  ,0x6e,
                  "char loltoml::detail::parser_t<events_aggregator_t>::parse_chars(const char (&)[N]) [Handler = events_aggregator_t, N = 2UL]"
                 );
  }
  cVar2 = input_stream_t::get(&this->input);
  if (cVar2 == (*expected)[0]) {
    return cVar2;
  }
  escape_char_abi_cxx11_(&local_50,(detail *)(ulong)(uint)(int)(*expected)[0],ch);
  std::operator+(&local_90,"\'",&local_50);
  std::operator+(&list,&local_90,"\'");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = (parser_error_t *)__cxa_allocate_exception(0x30);
  std::operator+(&local_70,"Expected one of the following symbols: ",&list);
  sVar1 = (this->input).m_processed;
  offset = 0;
  if (sVar1 != 0) {
    offset = sVar1 - 1;
  }
  parser_error_t::parser_error_t(this_00,&local_70,offset);
  __cxa_throw(this_00,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
}

Assistant:

char parse_chars(const char (&expected)[N]) {
        static_assert(N > 0, "No expected characters specified");
        assert(expected[N - 1] == '\0');

        char result = input.get();
        for (std::size_t i = 0; i + 1 < N; ++i) {
            if (result == expected[i]) {
                return result;
            }
        }

        std::string list = "\'" + escape_char(expected[0]) + "\'";

        for (std::size_t i = 1; i + 1 < N; ++i) {
            list += ", \'" + escape_char(expected[i]) + "\'";
        }

        throw parser_error_t("Expected one of the following symbols: " + list, last_char_offset());
    }